

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_kvs_header_reset_all_stats(filemgr *file)

{
  long lVar1;
  avl_node *paVar2;
  long in_RDI;
  kvs_header *kv_header;
  kvs_node *node;
  avl_node *a;
  avl_node *local_10;
  
  lVar1 = *(long *)(in_RDI + 0x170);
  pthread_spin_lock((pthread_spinlock_t *)(lVar1 + 0x38));
  local_10 = avl_first(*(avl_tree **)(lVar1 + 0x20));
  while (local_10 != (avl_node *)0x0) {
    paVar2 = avl_next(local_10);
    memset(&local_10[-4].right,0,0x38);
    local_10 = paVar2;
  }
  pthread_spin_unlock((pthread_spinlock_t *)(lVar1 + 0x38));
  return;
}

Assistant:

void fdb_kvs_header_reset_all_stats(struct filemgr *file)
{
    struct avl_node *a;
    struct kvs_node *node;
    struct kvs_header *kv_header = file->kv_header;

    spin_lock(&kv_header->lock);
    a = avl_first(kv_header->idx_id);
    while (a) {
        node = _get_entry(a, struct kvs_node, avl_id);
        a = avl_next(&node->avl_id);
        memset(&node->stat, 0x0, sizeof(node->stat));
    }
    spin_unlock(&kv_header->lock);
}